

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

bool __thiscall
libtorrent::torrent_info::parse_torrent_file
          (torrent_info *this,bdecode_node *torrent_file,error_code *ec,load_torrent_limits *cfg)

{
  vector<announce_entry> *this_00;
  string *psVar1;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  __seed;
  announce_entry *paVar2;
  string_view url_00;
  string_view url_01;
  bool bVar3;
  type_t tVar4;
  int iVar5;
  int iVar6;
  int64_t iVar7;
  byte bVar8;
  int iVar9;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *url;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view sVar10;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  char *in_stack_fffffffffffff9a8;
  int local_634;
  vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
  *local_630;
  bdecode_node url_seeds;
  string local_5e8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5c8;
  bdecode_node nodes;
  bdecode_node similar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique;
  bdecode_node announce_node;
  headers_t local_4b8;
  string local_4a0;
  string local_480;
  bdecode_node collections;
  string local_420;
  add_torrent_params p;
  bdecode_node url_1;
  bdecode_node info;
  
  tVar4 = bdecode_node::type(torrent_file);
  if (tVar4 != dict_t) {
    boost::system::error_code::operator=(ec,torrent_is_no_dict);
    return false;
  }
  sVar10._M_str = "info";
  sVar10._M_len = 4;
  bdecode_node::dict_find_dict(&info,torrent_file,sVar10);
  bVar3 = bdecode_node::operator_cast_to_bool(&info);
  if (!bVar3) {
    key_07._M_str = "magnet-uri";
    key_07._M_len = 10;
    bdecode_node::dict_find_string(&similar,torrent_file,key_07);
    bVar3 = bdecode_node::operator_cast_to_bool(&similar);
    if (bVar3) {
      sVar10 = bdecode_node::string_value(&similar);
      parse_magnet_uri(&p,sVar10,ec);
      bVar3 = ec->failed_;
      if (bVar3 == false) {
        (this->m_info_hash).v2.m_number._M_elems[7] = p.info_hashes.v2.m_number._M_elems[7];
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3) =
             p.info_hashes.v2.m_number._M_elems._12_8_;
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5) =
             p.info_hashes.v2.m_number._M_elems._20_8_;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = p.info_hashes._16_8_;
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1) =
             p.info_hashes.v2.m_number._M_elems._4_8_;
        *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems =
             p.info_hashes.v1.m_number._M_elems._0_8_;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) =
             p.info_hashes.v1.m_number._M_elems._8_8_;
        ::std::
        vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ::reserve(&(this->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                  ,((long)p.trackers.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)p.trackers.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) +
                   ((long)(this->m_urls).
                          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          .
                          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_urls).
                         super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                         .
                         super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x60);
        for (; p.trackers.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               p.trackers.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            p.trackers.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 p.trackers.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          ::std::
          vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
          ::emplace_back<std::__cxx11::string_const&>
                    ((vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
                      *)&this->m_urls,
                     p.trackers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      bVar8 = bVar3 ^ 1;
      add_torrent_params::~add_torrent_params(&p);
    }
    else {
      boost::system::error_code::operator=(ec,torrent_missing_info);
      bVar8 = 0;
    }
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&similar);
    goto LAB_0031a672;
  }
  bVar3 = parse_info_section(this,&info,ec,cfg->max_pieces);
  if ((bVar3) && (bVar3 = resolve_duplicate_filenames(this,cfg->max_duplicate_filenames,ec), bVar3))
  {
    bVar3 = info_hash_t::has_v2(&this->m_info_hash);
    if (bVar3) {
      key_05._M_str = "piece layers";
      key_05._M_len = 0xc;
      bdecode_node::dict_find_dict((bdecode_node *)&p,torrent_file,key_05);
      bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)&p);
      if ((bVar3) && (bVar3 = parse_piece_layers(this,(bdecode_node *)&p,ec), !bVar3)) {
        (this->m_files).m_piece_length = 0;
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&p);
        goto LAB_00319ffe;
      }
      ::std::
      _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       *)&p);
    }
    key_06._M_str = "similar";
    key_06._M_len = 7;
    bdecode_node::dict_find_list(&similar,torrent_file,key_06);
    bVar3 = bdecode_node::operator_cast_to_bool(&similar);
    if (bVar3) {
      for (iVar9 = 0; iVar5 = bdecode_node::list_size(&similar), iVar9 < iVar5; iVar9 = iVar9 + 1) {
        bdecode_node::list_at((bdecode_node *)&p,&similar,iVar9);
        tVar4 = bdecode_node::type((bdecode_node *)&p);
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&p);
        if (tVar4 == string_t) {
          bdecode_node::list_at((bdecode_node *)&p,&similar,iVar9);
          iVar5 = bdecode_node::string_length((bdecode_node *)&p);
          ::std::
          _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           *)&p);
          if (iVar5 == 0x14) {
            bdecode_node::list_at((bdecode_node *)&p,&similar,iVar9);
            collections.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)bdecode_node::string_ptr((bdecode_node *)&p);
            ::std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
            emplace_back<char_const*>
                      ((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                        *)&this->m_owned_similar_torrents,(char **)&collections);
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&p);
          }
        }
      }
    }
    key_08._M_str = "collections";
    key_08._M_len = 0xb;
    bdecode_node::dict_find_list(&collections,torrent_file,key_08);
    bVar3 = bdecode_node::operator_cast_to_bool(&collections);
    if (bVar3) {
      for (iVar9 = 0; iVar5 = bdecode_node::list_size(&collections), iVar9 < iVar5;
          iVar9 = iVar9 + 1) {
        bdecode_node::list_at((bdecode_node *)&p,&collections,iVar9);
        tVar4 = bdecode_node::type((bdecode_node *)&p);
        if (tVar4 == string_t) {
          announce_node.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)bdecode_node::string_ptr((bdecode_node *)&p);
          iVar5 = bdecode_node::string_length((bdecode_node *)&p);
          nodes.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(long)iVar5;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*,unsigned_long>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->m_owned_collections,(char **)&announce_node,(unsigned_long *)&nodes);
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&p);
      }
    }
    key_09._M_str = "announce-list";
    key_09._M_len = 0xd;
    bdecode_node::dict_find_list(&announce_node,torrent_file,key_09);
    bVar3 = bdecode_node::operator_cast_to_bool(&announce_node);
    if (bVar3) {
      iVar9 = bdecode_node::list_size(&announce_node);
      this_00 = &this->m_urls;
      aux::
      container_wrapper<libtorrent::v1_2::announce_entry,int,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>
      ::reserve<int,void>((container_wrapper<libtorrent::v1_2::announce_entry,int,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>
                           *)this_00,iVar9);
      iVar9 = bdecode_node::list_size(&announce_node);
      iVar5 = 0;
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      for (; iVar5 != iVar9; iVar5 = iVar5 + 1) {
        bdecode_node::list_at(&nodes,&announce_node,iVar5);
        tVar4 = bdecode_node::type(&nodes);
        if (tVar4 == list_t) {
          iVar6 = bdecode_node::list_size(&nodes);
          i = 0;
          if (iVar6 < 1) {
            iVar6 = i;
          }
          for (; iVar6 != i; i = i + 1) {
            sVar10 = bdecode_node::list_string_value_at(&nodes,i,(string_view)ZEXT816(0));
            v1_2::announce_entry::announce_entry((announce_entry *)&p,sVar10);
            aux::ltrim((string *)&p);
            if (p.ti.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)0x0) {
              p.dht_nodes.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = (undefined1)iVar5;
              p.dht_nodes.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
              p.dht_nodes.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ =
                   (p.dht_nodes.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 0xf0) + 1;
              bVar3 = aux::is_i2p_url((string *)&p);
              if (bVar3) {
                (this->m_flags).m_val = (this->m_flags).m_val | 4;
              }
              ::std::
              vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              ::push_back(&this_00->
                           super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          ,(value_type *)&p);
            }
            v1_2::announce_entry::~announce_entry((announce_entry *)&p);
          }
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&nodes);
      }
      if ((this->m_urls).
          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          .
          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->m_urls).
          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          .
          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        aux::
        random_shuffle<libtorrent::aux::container_wrapper<libtorrent::v1_2::announce_entry,int,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>>
                  (this_00);
        __seed._M_current =
             (this->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             .
             super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
        paVar2 = (this->m_urls).
                 super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                 .
                 super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__seed._M_current != paVar2) {
          ::std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>,_libtorrent::v1_2::announce_entry>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>,_libtorrent::v1_2::announce_entry>
                               *)&p,__seed,(((long)paVar2 - (long)__seed._M_current) / 0x60 + 1) / 2
                             );
          if (p.ti.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::parse_torrent_file(libtorrent::bdecode_node_const&,boost::system::error_code&,libtorrent::load_torrent_limits_const&)::__0>>
                      (__seed._M_current,paVar2);
          }
          else {
            ::std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,libtorrent::v1_2::announce_entry*,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::parse_torrent_file(libtorrent::bdecode_node_const&,boost::system::error_code&,libtorrent::load_torrent_limits_const&)::__0>>
                      (__seed._M_current,paVar2,
                       p.ti.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi,
                       p.ti.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
          }
          ::std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>,_libtorrent::v1_2::announce_entry>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>,_libtorrent::v1_2::announce_entry>
                      *)&p);
        }
      }
    }
    if ((this->m_urls).
        super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        .
        super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_urls).
        super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        .
        super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      key._M_str = "announce";
      key._M_len = 8;
      sVar10 = bdecode_node::dict_find_string_value(torrent_file,key,(string_view)ZEXT816(0));
      v1_2::announce_entry::announce_entry((announce_entry *)&p,sVar10);
      p.dht_nodes.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
      p.dht_nodes.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ =
           (p.dht_nodes.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 0xf0) + 1;
      aux::ltrim((string *)&p);
      bVar3 = aux::is_i2p_url((string *)&p);
      if (bVar3) {
        (this->m_flags).m_val = (this->m_flags).m_val | 4;
      }
      if (p.ti.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::
        vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ::push_back(&(this->m_urls).
                     super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                    ,(value_type *)&p);
      }
      v1_2::announce_entry::~announce_entry((announce_entry *)&p);
    }
    key_10._M_str = "nodes";
    key_10._M_len = 5;
    bdecode_node::dict_find_list(&nodes,torrent_file,key_10);
    bVar3 = bdecode_node::operator_cast_to_bool(&nodes);
    if (bVar3) {
      iVar9 = bdecode_node::list_size(&nodes);
      iVar5 = 0;
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      local_630 = (vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                   *)&this->m_nodes;
      for (; iVar9 != iVar5; iVar5 = iVar5 + 1) {
        bdecode_node::list_at((bdecode_node *)&p,&nodes,iVar5);
        tVar4 = bdecode_node::type((bdecode_node *)&p);
        if ((tVar4 == list_t) && (iVar6 = bdecode_node::list_size((bdecode_node *)&p), 1 < iVar6)) {
          bdecode_node::list_at(&url_seeds,(bdecode_node *)&p,0);
          tVar4 = bdecode_node::type(&url_seeds);
          if (tVar4 == string_t) {
            bdecode_node::list_at(&url_1,(bdecode_node *)&p,1);
            tVar4 = bdecode_node::type(&url_1);
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&url_1);
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&url_seeds);
            if (tVar4 != int_t) goto LAB_0031a22c;
            bdecode_node::list_at(&url_seeds,(bdecode_node *)&p,0);
            unique._M_t._M_impl._0_16_ = bdecode_node::string_value(&url_seeds);
            bdecode_node::list_at(&url_1,(bdecode_node *)&p,1);
            iVar7 = bdecode_node::int_value(&url_1);
            local_634 = (int)iVar7;
            ::std::
            vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
            ::emplace_back<std::basic_string_view<char,std::char_traits<char>>,int>
                      (local_630,(basic_string_view<char,_std::char_traits<char>_> *)&unique,
                       &local_634);
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&url_1);
          }
          ::std::
          _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           *)&url_seeds);
        }
LAB_0031a22c:
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&p);
      }
    }
    key_00._M_str = "creation date";
    key_00._M_len = 0xd;
    iVar7 = bdecode_node::dict_find_int_value(torrent_file,key_00,-1);
    if (-1 < iVar7) {
      this->m_creation_date = iVar7;
    }
    key_11._M_str = "url-list";
    key_11._M_len = 8;
    bdecode_node::dict_find(&url_seeds,torrent_file,key_11);
    bVar3 = bdecode_node::operator_cast_to_bool(&url_seeds);
    if (((bVar3) && (tVar4 = bdecode_node::type(&url_seeds), tVar4 == string_t)) &&
       (iVar9 = bdecode_node::string_length(&url_seeds), 0 < iVar9)) {
      bdecode_node::string_value(&url_seeds);
      url_00._M_str = in_stack_fffffffffffff9a8;
      url_00._M_len = 0x31a2ce;
      maybe_url_encode_abi_cxx11_(url_00);
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      local_4a0._M_string_length = 0;
      local_4a0.field_2._M_local_buf[0] = '\0';
      local_4b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_4b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      web_seed_entry::web_seed_entry((web_seed_entry *)&p,&local_480,&local_4a0,&local_4b8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_4b8);
      ::std::__cxx11::string::~string((string *)&local_4a0);
      ::std::__cxx11::string::~string((string *)&local_480);
      if ((((this->m_flags).m_val & 1) != 0) &&
         (iVar9 = file_storage::num_files(&this->m_files), 1 < iVar9)) {
        aux::ensure_trailing_slash((string *)&p);
      }
      ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::
      emplace_back<libtorrent::web_seed_entry>(&this->m_web_seeds,(web_seed_entry *)&p);
      web_seed_entry::~web_seed_entry((web_seed_entry *)&p);
    }
    else {
      bVar3 = bdecode_node::operator_cast_to_bool(&url_seeds);
      if ((bVar3) && (tVar4 = bdecode_node::type(&url_seeds), tVar4 == list_t)) {
        unique._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &unique._M_t._M_impl.super__Rb_tree_header._M_header;
        unique._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        unique._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        unique._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        unique._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             unique._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar9 = bdecode_node::list_size(&url_seeds);
        iVar5 = 0;
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        for (; iVar9 != iVar5; iVar5 = iVar5 + 1) {
          bdecode_node::list_at(&url_1,&url_seeds,iVar5);
          tVar4 = bdecode_node::type(&url_1);
          if ((tVar4 == string_t) && (iVar6 = bdecode_node::string_length(&url_1), iVar6 != 0)) {
            bdecode_node::string_value(&url_1);
            url_01._M_str = in_stack_fffffffffffff9a8;
            url_01._M_len = 0x31a456;
            maybe_url_encode_abi_cxx11_(url_01);
            local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
            local_5e8._M_string_length = 0;
            local_5e8.field_2._M_local_buf[0] = '\0';
            local_5c8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_5c8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_5c8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            web_seed_entry::web_seed_entry((web_seed_entry *)&p,&local_420,&local_5e8,&local_5c8);
            ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_5c8);
            ::std::__cxx11::string::~string((string *)&local_5e8);
            ::std::__cxx11::string::~string((string *)&local_420);
            if ((((this->m_flags).m_val & 1) != 0) &&
               (iVar6 = file_storage::num_files(&this->m_files), 1 < iVar6)) {
              aux::ensure_trailing_slash((string *)&p);
            }
            pVar11 = ::std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&unique,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&p);
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
              ::emplace_back<libtorrent::web_seed_entry>(&this->m_web_seeds,(web_seed_entry *)&p);
            }
            web_seed_entry::~web_seed_entry((web_seed_entry *)&p);
          }
          ::std::
          _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           *)&url_1);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&unique._M_t);
      }
    }
    key_01._M_str = "comment.utf-8";
    key_01._M_len = 0xd;
    p._0_16_ = bdecode_node::dict_find_string_value(torrent_file,key_01,(string_view)ZEXT816(0));
    psVar1 = &this->m_comment;
    ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)psVar1,(basic_string_view<char,_std::char_traits<char>_> *)&p);
    if ((this->m_comment)._M_string_length == 0) {
      key_02._M_str = "comment";
      key_02._M_len = 7;
      p._0_16_ = bdecode_node::dict_find_string_value(torrent_file,key_02,(string_view)ZEXT816(0));
      ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)psVar1,(basic_string_view<char,_std::char_traits<char>_> *)&p);
    }
    aux::verify_encoding(psVar1);
    key_03._M_str = "created by.utf-8";
    key_03._M_len = 0x10;
    p._0_16_ = bdecode_node::dict_find_string_value(torrent_file,key_03,(string_view)ZEXT816(0));
    psVar1 = &this->m_created_by;
    ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)psVar1,(basic_string_view<char,_std::char_traits<char>_> *)&p);
    if ((this->m_created_by)._M_string_length == 0) {
      key_04._M_str = "created by";
      key_04._M_len = 10;
      p._0_16_ = bdecode_node::dict_find_string_value(torrent_file,key_04,(string_view)ZEXT816(0));
      ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)psVar1,(basic_string_view<char,_std::char_traits<char>_> *)&p);
    }
    aux::verify_encoding(psVar1);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&url_seeds);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&nodes);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&announce_node);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&collections);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&similar);
    bVar8 = 1;
  }
  else {
LAB_00319ffe:
    bVar8 = 0;
  }
LAB_0031a672:
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&info);
  return (bool)bVar8;
}

Assistant:

bool torrent_info::parse_torrent_file(bdecode_node const& torrent_file
		, error_code& ec, load_torrent_limits const& cfg)
	{
		if (torrent_file.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_is_no_dict;
			return false;
		}

		bdecode_node const info = torrent_file.dict_find_dict("info");
		if (!info)
		{
			bdecode_node const uri = torrent_file.dict_find_string("magnet-uri");
			if (uri)
			{
				auto const p = parse_magnet_uri(uri.string_value(), ec);
				if (ec) return false;

				m_info_hash = p.info_hashes;
				m_urls.reserve(m_urls.size() + p.trackers.size());
				for (auto const& url : p.trackers)
					m_urls.emplace_back(url);

				return true;
			}

			ec = errors::torrent_missing_info;
			return false;
		}

		if (!parse_info_section(info, ec, cfg.max_pieces)) return false;
		if (!resolve_duplicate_filenames(cfg.max_duplicate_filenames, ec)) return false;

		if (m_info_hash.has_v2())
		{
			// allow torrent files without piece layers, just like we allow magnet
			// links. However, if there are piece layers, make sure they're
			// valid
			bdecode_node const& e = torrent_file.dict_find_dict("piece layers");
			if (e && !parse_piece_layers(e, ec))
			{
				TORRENT_ASSERT(ec);
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}
		}

#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		bdecode_node const similar = torrent_file.dict_find_list("similar");
		if (similar)
		{
			for (int i = 0; i < similar.list_size(); ++i)
			{
				if (similar.list_at(i).type() != bdecode_node::string_t)
					continue;

				if (similar.list_at(i).string_length() != 20)
					continue;

				m_owned_similar_torrents.emplace_back(
					similar.list_at(i).string_ptr());
			}
		}

		bdecode_node const collections = torrent_file.dict_find_list("collections");
		if (collections)
		{
			for (int i = 0; i < collections.list_size(); ++i)
			{
				bdecode_node const str = collections.list_at(i);

				if (str.type() != bdecode_node::string_t) continue;

				m_owned_collections.emplace_back(str.string_ptr()
					, aux::numeric_cast<std::size_t>(str.string_length()));
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

		// extract the url of the tracker
		bdecode_node const announce_node = torrent_file.dict_find_list("announce-list");
		if (announce_node)
		{
			m_urls.reserve(announce_node.list_size());
			for (int j = 0, end(announce_node.list_size()); j < end; ++j)
			{
				bdecode_node const tier = announce_node.list_at(j);
				if (tier.type() != bdecode_node::list_t) continue;
				for (int k = 0, end2(tier.list_size()); k < end2; ++k)
				{
					announce_entry e(tier.list_string_value_at(k));
					aux::ltrim(e.url);
					if (e.url.empty()) continue;
					e.tier = std::uint8_t(j);
					e.fail_limit = 0;
					e.source = announce_entry::source_torrent;
#if TORRENT_USE_I2P
					if (aux::is_i2p_url(e.url)) m_flags |= i2p;
#endif
					m_urls.push_back(e);
				}
			}

			if (!m_urls.empty())
			{
				// shuffle each tier
				aux::random_shuffle(m_urls);
				std::stable_sort(m_urls.begin(), m_urls.end()
					, [](announce_entry const& lhs, announce_entry const& rhs)
					{ return lhs.tier < rhs.tier; });
			}
		}

		if (m_urls.empty())
		{
			announce_entry e(torrent_file.dict_find_string_value("announce"));
			e.fail_limit = 0;
			e.source = announce_entry::source_torrent;
			aux::ltrim(e.url);
#if TORRENT_USE_I2P
			if (aux::is_i2p_url(e.url)) m_flags |= i2p;
#endif
			if (!e.url.empty()) m_urls.push_back(e);
		}

		bdecode_node const nodes = torrent_file.dict_find_list("nodes");
		if (nodes)
		{
			for (int i = 0, end(nodes.list_size()); i < end; ++i)
			{
				bdecode_node const n = nodes.list_at(i);
				if (n.type() != bdecode_node::list_t
					|| n.list_size() < 2
					|| n.list_at(0).type() != bdecode_node::string_t
					|| n.list_at(1).type() != bdecode_node::int_t)
					continue;
				m_nodes.emplace_back(
					n.list_at(0).string_value()
					, int(n.list_at(1).int_value()));
			}
		}

		// extract creation date
		std::int64_t const cd = torrent_file.dict_find_int_value("creation date", -1);
		if (cd >= 0)
		{
			m_creation_date = std::time_t(cd);
		}

		// if there are any url-seeds, extract them
		bdecode_node const url_seeds = torrent_file.dict_find("url-list");
		if (url_seeds && url_seeds.type() == bdecode_node::string_t
			&& url_seeds.string_length() > 0)
		{
			web_seed_entry ent(maybe_url_encode(url_seeds.string_value()));
			if ((m_flags & multifile) && num_files() > 1)
				aux::ensure_trailing_slash(ent.url);
			m_web_seeds.push_back(std::move(ent));
		}
		else if (url_seeds && url_seeds.type() == bdecode_node::list_t)
		{
			// only add a URL once
			std::set<std::string> unique;
			for (int i = 0, end(url_seeds.list_size()); i < end; ++i)
			{
				bdecode_node const url = url_seeds.list_at(i);
				if (url.type() != bdecode_node::string_t) continue;
				if (url.string_length() == 0) continue;
				web_seed_entry ent(maybe_url_encode(url.string_value()));
				if ((m_flags & multifile) && num_files() > 1)
					aux::ensure_trailing_slash(ent.url);
				if (!unique.insert(ent.url).second) continue;
				m_web_seeds.push_back(std::move(ent));
			}
		}

		m_comment = torrent_file.dict_find_string_value("comment.utf-8");
		if (m_comment.empty()) m_comment = torrent_file.dict_find_string_value("comment");
		aux::verify_encoding(m_comment);

		m_created_by = torrent_file.dict_find_string_value("created by.utf-8");
		if (m_created_by.empty()) m_created_by = torrent_file.dict_find_string_value("created by");
		aux::verify_encoding(m_created_by);

		return true;
	}